

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.h
# Opt level: O0

void __thiscall bloaty::Options::add_data_source(Options *this,char *value)

{
  LogMessage *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long in_RSI;
  undefined8 in_RDI;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff90;
  LogMessage *in_stack_ffffffffffffffa0;
  LogMessage local_48;
  
  if (in_RSI == 0) {
    other = &local_48;
    google::protobuf::internal::LogMessage::LogMessage
              (in_stack_ffffffffffffffa0,(LogLevel_conflict)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff90,(int)((ulong)other >> 0x20));
    this_00 = google::protobuf::internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff90,(char *)other);
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)0x181f4b);
  }
  pbVar1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x181f59);
  std::__cxx11::string::assign((char *)pbVar1);
  return;
}

Assistant:

inline void Options::add_data_source(const char* value) {
  GOOGLE_DCHECK(value != nullptr);
  data_source_.Add()->assign(value);
  // @@protoc_insertion_point(field_add_char:bloaty.Options.data_source)
}